

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_as_bool(void)

{
  char cVar1;
  undefined8 uVar2;
  char *__format;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_200 [128];
  undefined1 local_180 [344];
  
  bson_init(local_180);
  bson_append_int32(local_180,"int32[true]",0xffffffff,1);
  bson_append_int32(local_180,"int32[false]",0xffffffff,0);
  bson_append_int64(local_180,"int64[true]",0xffffffff,1);
  bson_append_int64(local_180,"int64[false]",0xffffffff,0);
  bson_append_double(0x3ff0000000000000,local_180,"int64[true]",0xffffffff);
  bson_append_double(0,local_180,"int64[false]",0xffffffff);
  bson_iter_init(auStack_200,local_180);
  bson_iter_next(auStack_200);
  cVar1 = bson_iter_as_bool(auStack_200);
  if (cVar1 == '\0') {
    __format = "FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n";
    uVar2 = 0x246;
  }
  else {
    bson_iter_next(auStack_200);
    cVar1 = bson_iter_as_bool(auStack_200);
    if (cVar1 == '\0') {
      bson_iter_next(auStack_200);
      cVar1 = bson_iter_as_bool(auStack_200);
      if (cVar1 == '\0') {
        __format = "FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n";
        uVar2 = 0x24a;
      }
      else {
        bson_iter_next(auStack_200);
        cVar1 = bson_iter_as_bool(auStack_200);
        if (cVar1 == '\0') {
          bson_iter_next(auStack_200);
          cVar1 = bson_iter_as_bool(auStack_200);
          if (cVar1 == '\0') {
            __format = "FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n";
            uVar2 = 0x24e;
          }
          else {
            bson_iter_next(auStack_200);
            cVar1 = bson_iter_as_bool(auStack_200);
            if (cVar1 == '\0') {
              bson_destroy(local_180);
              return;
            }
            __format = "FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n";
            uVar2 = 0x250;
          }
        }
        else {
          __format = "FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n";
          uVar2 = 0x24c;
        }
      }
    }
    else {
      __format = "FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n";
      uVar2 = 0x248;
    }
  }
  fprintf(_stderr,__format,uVar2);
  abort();
}

Assistant:

static void
test_bson_iter_as_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   bson_append_int32 (&b, "int32[true]", -1, 1);
   bson_append_int32 (&b, "int32[false]", -1, 0);
   bson_append_int64 (&b, "int64[true]", -1, 1);
   bson_append_int64 (&b, "int64[false]", -1, 0);
   bson_append_double (&b, "int64[true]", -1, 1.0);
   bson_append_double (&b, "int64[false]", -1, 0.0);

   bson_iter_init (&iter, &b);
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));

   bson_destroy (&b);
}